

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_CutComputeTruthMux
              (Lf_Man_t *p,Lf_Cut_t *pCut0,Lf_Cut_t *pCut1,Lf_Cut_t *pCutC,int fCompl0,int fCompl1,
              int fComplC,Lf_Cut_t *pCutR)

{
  uint uVar1;
  int nWords_00;
  uint uVar2;
  int iVar3;
  word *pIn;
  word *pIn_00;
  word *pIn_01;
  word *pTruthC;
  word *pTruth1;
  word *pTruth0;
  int nWords;
  int fCompl;
  int LutSize;
  int truthId;
  int nOldSupp;
  word uTruthC [64];
  word uTruth1 [64];
  word uTruth0 [64];
  word uTruth [64];
  int fCompl1_local;
  int fCompl0_local;
  Lf_Cut_t *pCutC_local;
  Lf_Cut_t *pCut1_local;
  Lf_Cut_t *pCut0_local;
  Lf_Man_t *p_local;
  
  if (p->pPars->nLutSize < 7) {
    p_local._4_4_ = Lf_CutComputeTruthMux6(p,pCut0,pCut1,pCutC,fCompl0,fCompl1,fComplC,pCutR);
  }
  else {
    uVar1 = *(uint *)&pCutR->field_0x14 >> 0x18;
    iVar3 = p->pPars->nLutSize;
    nWords_00 = Abc_Truth6WordNum(iVar3);
    pIn = Lf_CutTruth(p,pCut0);
    pIn_00 = Lf_CutTruth(p,pCut1);
    pIn_01 = Lf_CutTruth(p,pCutC);
    uVar2 = Abc_LitIsCompl(pCut0->iFunc);
    Abc_TtCopy(uTruth1 + 0x3f,pIn,nWords_00,uVar2 ^ fCompl0);
    uVar2 = Abc_LitIsCompl(pCut1->iFunc);
    Abc_TtCopy(uTruthC + 0x3f,pIn_00,nWords_00,uVar2 ^ fCompl1);
    uVar2 = Abc_LitIsCompl(pCutC->iFunc);
    Abc_TtCopy((word *)&truthId,pIn_01,nWords_00,uVar2 ^ fComplC);
    Abc_TtExpand(uTruth1 + 0x3f,iVar3,(int *)(pCut0 + 1),*(uint *)&pCut0->field_0x14 >> 0x18,
                 (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
    Abc_TtExpand(uTruthC + 0x3f,iVar3,(int *)(pCut1 + 1),*(uint *)&pCut1->field_0x14 >> 0x18,
                 (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
    Abc_TtExpand((word *)&truthId,iVar3,(int *)(pCutC + 1),*(uint *)&pCutC->field_0x14 >> 0x18,
                 (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
    Abc_TtMux(uTruth0 + 0x3f,(word *)&truthId,uTruthC + 0x3f,uTruth1 + 0x3f,nWords_00);
    uVar2 = (uint)uTruth0[0x3f];
    if ((uTruth0[0x3f] & 1) != 0) {
      Abc_TtNot(uTruth0 + 0x3f,nWords_00);
    }
    iVar3 = Abc_TtMinBase(uTruth0 + 0x3f,(int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18,
                          iVar3);
    *(uint *)&pCutR->field_0x14 = *(uint *)&pCutR->field_0x14 & 0xffffff | iVar3 << 0x18;
    if ((uTruth0[0x3f] & 1) != 0) {
      __assert_fail("(uTruth[0] & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x41f,
                    "int Lf_CutComputeTruthMux(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, int, Lf_Cut_t *)"
                   );
    }
    iVar3 = Vec_MemHashInsert(p->vTtMem,uTruth0 + 0x3f);
    iVar3 = Abc_Var2Lit(iVar3,uVar2 & 1);
    pCutR->iFunc = iVar3;
    if (uVar1 < *(uint *)&pCutR->field_0x14 >> 0x18) {
      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x422,
                    "int Lf_CutComputeTruthMux(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, int, Lf_Cut_t *)"
                   );
    }
    p_local._4_4_ = (uint)(*(uint *)&pCutR->field_0x14 >> 0x18 < uVar1);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Lf_CutComputeTruthMux( Lf_Man_t * p, Lf_Cut_t * pCut0, Lf_Cut_t * pCut1, Lf_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, Lf_Cut_t * pCutR )
{
    if ( p->pPars->nLutSize <= 6 )
        return Lf_CutComputeTruthMux6( p, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, pCutR );
    {
    word uTruth[LF_TT_WORDS], uTruth0[LF_TT_WORDS], uTruth1[LF_TT_WORDS], uTruthC[LF_TT_WORDS];
    int nOldSupp   = pCutR->nLeaves, truthId;
    int LutSize    = p->pPars->nLutSize, fCompl;
    int nWords     = Abc_Truth6WordNum(LutSize);
    word * pTruth0 = Lf_CutTruth(p, pCut0);
    word * pTruth1 = Lf_CutTruth(p, pCut1);
    word * pTruthC = Lf_CutTruth(p, pCutC);
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(pCut0->iFunc) ^ fCompl0 );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(pCut1->iFunc) ^ fCompl1 );
    Abc_TtCopy( uTruthC, pTruthC, nWords, Abc_LitIsCompl(pCutC->iFunc) ^ fComplC );
    Abc_TtExpand( uTruth0, LutSize, pCut0->pLeaves, pCut0->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    Abc_TtExpand( uTruth1, LutSize, pCut1->pLeaves, pCut1->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    Abc_TtExpand( uTruthC, LutSize, pCutC->pLeaves, pCutC->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    Abc_TtMux( uTruth, uTruthC, uTruth1, uTruth0, nWords );
    fCompl         = (int)(uTruth[0] & 1);
    if ( fCompl ) Abc_TtNot( uTruth, nWords );
    pCutR->nLeaves = Abc_TtMinBase( uTruth, pCutR->pLeaves, pCutR->nLeaves, LutSize );
    assert( (uTruth[0] & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    pCutR->iFunc   = Abc_Var2Lit( truthId, fCompl );
    assert( (int)pCutR->nLeaves <= nOldSupp );
    return (int)pCutR->nLeaves < nOldSupp;
    }
}